

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O2

json * __thiscall
nanojson3::json::json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::read_number
          (json *__return_storage_ptr__,
          json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  bool bVar1;
  int_type iVar2;
  uint uVar3;
  uint __value;
  bad_format *pbVar4;
  char *__last;
  int iVar5;
  char *__last_00;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  longdouble lVar9;
  string_view reason;
  string_view reason_00;
  string_view reason_01;
  string_view reason_02;
  string_view reason_03;
  string_view reason_04;
  __integer_from_chars_result_type<int> _Var10;
  __integer_from_chars_result_type<long_long> _Var11;
  __integer_to_chars_result_type<int> _Var12;
  undefined1 auVar13 [12];
  int exp_value;
  char exp_part [32];
  char buffer [128];
  char local_38 [8];
  
  buffer[0x70] = '\0';
  buffer[0x71] = '\0';
  buffer[0x72] = '\0';
  buffer[0x73] = '\0';
  buffer[0x74] = '\0';
  buffer[0x75] = '\0';
  buffer[0x76] = '\0';
  buffer[0x77] = '\0';
  buffer[0x78] = '\0';
  buffer[0x79] = '\0';
  buffer[0x7a] = '\0';
  buffer[0x7b] = '\0';
  buffer[0x7c] = '\0';
  buffer[0x7d] = '\0';
  buffer[0x7e] = '\0';
  buffer[0x7f] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  buffer[100] = '\0';
  buffer[0x65] = '\0';
  buffer[0x66] = '\0';
  buffer[0x67] = '\0';
  buffer[0x68] = '\0';
  buffer[0x69] = '\0';
  buffer[0x6a] = '\0';
  buffer[0x6b] = '\0';
  buffer[0x6c] = '\0';
  buffer[0x6d] = '\0';
  buffer[0x6e] = '\0';
  buffer[0x6f] = '\0';
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  bVar1 = input_stream::eat(&this->input_,0x2d);
  if (bVar1) {
    buffer[0] = '-';
  }
  uVar6 = (ulong)bVar1;
  if ((this->option_bits_ & allow_number_with_plus_sign) != none) {
    input_stream::eat(&this->input_,0x2b);
  }
  bVar1 = input_stream::eat(&this->input_,0x30);
  if (bVar1) {
    buffer[uVar6] = '0';
    uVar6 = uVar6 + 1;
    uVar3 = 0;
  }
  else {
    iVar2 = input_stream::peek(&this->input_);
    if (9 < iVar2 - 0x30U) {
      pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
      uVar3 = input_stream::peek(&this->input_);
      reason_02._M_str = "invalid number format: expected a digit";
      reason_02._M_len = 0x27;
      bad_format(pbVar4,this,reason_02,(optional<int>)((ulong)uVar3 | 0x100000000));
      goto LAB_00107fb3;
    }
    uVar3 = 0;
    while (iVar2 = input_stream::peek(&this->input_), iVar2 - 0x30U < 10) {
      if ((long)uVar6 < 0x3c) {
        iVar2 = input_stream::eat(&this->input_);
        buffer[uVar6] = (char)iVar2;
        uVar6 = uVar6 + 1;
      }
      else {
        if (uVar3 == 0x7fffffff) {
          pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
          reason_04._M_str = "invalid number format: too long integer sequence";
          reason_04._M_len = 0x30;
          bad_format(pbVar4,this,reason_04,(optional<int>)0x0);
          goto LAB_00107fb3;
        }
        uVar3 = uVar3 + 1;
        input_stream::eat(&this->input_);
      }
    }
  }
  bVar1 = input_stream::eat(&this->input_,0x2e);
  uVar7 = uVar6;
  if (bVar1) {
    if (0x3f < (long)uVar6) {
      __assert_fail("p < fraction_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                    ,0x3fa,
                    "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                   );
    }
    buffer[uVar6] = '.';
    iVar2 = input_stream::peek(&this->input_);
    if (iVar2 - 0x30U < 10) {
      if ((buffer[0] == '0') || ((buffer[0] == '-' && (buffer[1] == '0')))) {
        while (iVar2 = input_stream::peek(&this->input_), iVar2 == 0x30) {
          if (uVar3 == 0x80000000) {
            pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
            reason_00._M_str = "invalid number format: too long integer sequence";
            reason_00._M_len = 0x30;
            bad_format(pbVar4,this,reason_00,(optional<int>)0x0);
            goto LAB_00107fb3;
          }
          uVar3 = uVar3 - 1;
          input_stream::eat(&this->input_);
        }
      }
      do {
        uVar7 = uVar6 + 1;
        do {
          iVar2 = input_stream::peek(&this->input_);
          if (9 < iVar2 - 0x30U) goto LAB_00107d03;
          iVar2 = input_stream::eat(&this->input_);
        } while (0x3e < (long)uVar6);
        buffer[uVar6 + 1] = (char)iVar2;
        uVar6 = uVar7;
      } while( true );
    }
    pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
    uVar3 = input_stream::peek(&this->input_);
    reason_03._M_str = "invalid number format: expected a digit";
    reason_03._M_len = 0x27;
    bad_format(pbVar4,this,reason_03,(optional<int>)((ulong)uVar3 | 0x100000000));
    goto LAB_00107fb3;
  }
LAB_00107d03:
  __last = buffer + uVar7;
  iVar2 = input_stream::peek(&this->input_);
  if ((iVar2 == 0x65) || (iVar2 = input_stream::peek(&this->input_), iVar2 == 0x45)) {
    input_stream::eat(&this->input_);
    exp_part[0x10] = '\0';
    exp_part[0x11] = '\0';
    exp_part[0x12] = '\0';
    exp_part[0x13] = '\0';
    exp_part[0x14] = '\0';
    exp_part[0x15] = '\0';
    exp_part[0x16] = '\0';
    exp_part[0x17] = '\0';
    exp_part[0x18] = '\0';
    exp_part[0x19] = '\0';
    exp_part[0x1a] = '\0';
    exp_part[0x1b] = '\0';
    exp_part[0x1c] = '\0';
    exp_part[0x1d] = '\0';
    exp_part[0x1e] = '\0';
    exp_part[0x1f] = '\0';
    exp_part[0] = '\0';
    exp_part[1] = '\0';
    exp_part[2] = '\0';
    exp_part[3] = '\0';
    exp_part[4] = '\0';
    exp_part[5] = '\0';
    exp_part[6] = '\0';
    exp_part[7] = '\0';
    exp_part[8] = '\0';
    exp_part[9] = '\0';
    exp_part[10] = '\0';
    exp_part[0xb] = '\0';
    exp_part[0xc] = '\0';
    exp_part[0xd] = '\0';
    exp_part[0xe] = '\0';
    exp_part[0xf] = '\0';
    bVar1 = input_stream::eat(&this->input_,0x2d);
    if (!bVar1) {
      input_stream::eat(&this->input_,0x2b);
    }
    else {
      exp_part[0] = '-';
    }
    uVar6 = (ulong)bVar1;
    iVar2 = input_stream::peek(&this->input_);
    if (9 < iVar2 - 0x30U) {
      pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
      uVar3 = input_stream::peek(&this->input_);
      reason._M_str = "invalid number format: expected a digit";
      reason._M_len = 0x27;
      bad_format(pbVar4,this,reason,(optional<int>)((ulong)uVar3 | 0x100000000));
      __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
    }
    while (iVar2 = input_stream::peek(&this->input_), iVar2 - 0x30U < 10) {
      iVar2 = input_stream::eat(&this->input_);
      if (uVar6 < 0x20) {
        exp_part[uVar6] = (char)iVar2;
        uVar6 = uVar6 + 1;
      }
    }
    __last_00 = exp_part + uVar6;
    exp_value = 0;
    _Var10 = std::from_chars<int>(exp_part,__last_00,&exp_value,10);
    if (_Var10.ptr == __last_00 && _Var10.ec == 0) {
      if ((int)uVar3 < 1) {
        __value = 0x80000000;
        if (uVar3 == 0 || (int)(-0x80000000 - uVar3) <= exp_value) goto LAB_00107ec6;
      }
      else {
        __value = 0x7fffffff;
        if (exp_value <= (int)(uVar3 ^ 0x7fffffff)) {
LAB_00107ec6:
          __value = uVar3 + exp_value;
          if (uVar3 + exp_value == 0) {
            bVar8 = true;
            goto LAB_00107f07;
          }
        }
      }
    }
    else {
      if ((_Var10.ec != result_out_of_range) || (_Var10.ptr != __last_00)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                      ,0x437,
                      "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                     );
      }
      __value = (exp_part[0] != '-') + 0x7fffffff;
    }
  }
  else {
    __value = uVar3;
    if (uVar3 == 0) {
      bVar8 = true;
      if (!bVar1) {
        exp_part[0] = '\0';
        exp_part[1] = '\0';
        exp_part[2] = '\0';
        exp_part[3] = '\0';
        exp_part[4] = '\0';
        exp_part[5] = '\0';
        exp_part[6] = '\0';
        exp_part[7] = '\0';
        _Var11 = std::from_chars<long_long>(buffer,__last,(longlong *)exp_part,10);
        if (_Var11.ptr == __last && _Var11.ec == 0) {
          *(ulong *)&(__return_storage_ptr__->value_).
                     super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                     .
                     super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
               = CONCAT71(exp_part._1_7_,exp_part[0]);
          *(__index_type *)
           ((long)&(__return_storage_ptr__->value_).
                   super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                   .
                   super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           + 0x20) = '\x03';
          return __return_storage_ptr__;
        }
      }
      goto LAB_00107f07;
    }
  }
  if (0x7f < (long)uVar7) {
    __assert_fail("p < decimal_limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x43f,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  *__last = 'e';
  _Var12 = std::__to_chars_i<int>(buffer + uVar7 + 1,local_38,__value,10);
  __last = _Var12.ptr;
  if (_Var12.ec != 0) {
    pbVar4 = (bad_format *)__cxa_allocate_exception(0x10);
    reason_01._M_str = "invalid number format: unexpected error.";
    reason_01._M_len = 0x28;
    bad_format(pbVar4,this,reason_01,(optional<int>)0x0);
LAB_00107fb3:
    __cxa_throw(pbVar4,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar8 = -1 < (int)__value;
LAB_00107f07:
  lVar9 = (longdouble)0;
  exp_part[0] = SUB101(lVar9,0);
  exp_part._1_7_ = (undefined7)((unkuint10)lVar9 >> 8);
  exp_part._8_2_ = (undefined2)((unkuint10)lVar9 >> 0x40);
  auVar13 = std::from_chars(buffer,__last,(longdouble *)exp_part,general);
  iVar5 = auVar13._8_4_;
  if ((iVar5 != 0) && (iVar5 != 0x22)) {
    __assert_fail("ec == std::errc{} || ec == std::errc::result_out_of_range",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x45b,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  if (auVar13._0_8_ != __last) {
    __assert_fail("ptr == p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x45c,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  lVar9 = (longdouble)0;
  if (iVar5 == 0x22) {
    if (bVar8) {
      lVar9 = *(longdouble *)(&DAT_001100c0 + (ulong)(buffer[0] == '-') * 0x10);
    }
  }
  else {
    if (iVar5 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                    ,0x469,
                    "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                   );
    }
    lVar9 = (longdouble)CONCAT28(exp_part._8_2_,CONCAT71(exp_part._1_7_,exp_part[0]));
  }
  *(longdouble *)
   &(__return_storage_ptr__->value_).
    super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
    .
    super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
       = lVar9;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value_).
           super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
           .
           super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
   + 0x20) = '\x04';
  return __return_storage_ptr__;
}

Assistant:

json read_number()
        {
            constexpr auto is_digit = [](int_type i)-> bool { return i >= '0' && i <= '9'; }; // locale-independent is_digit

            char buffer[128]{};
            char* p = buffer;
            char* const integer_limit = buffer + 60;
            char* const fraction_limit = buffer + 64;
            char* const decimal_limit = buffer + 128;

            int exp_offset = 0;
            constexpr auto maximum_exp_offset = (std::numeric_limits<decltype(exp_offset)>::max)();
            constexpr auto minimum_exp_offset = (std::numeric_limits<decltype(exp_offset)>::lowest)();

            bool integer_type = true;

            // parse integer part
            {
                if (input_.eat('-')) { *p++ = '-'; }                                                  // minus sign
                if (has_option(json_parse_option::allow_number_with_plus_sign) && input_.eat('+')) {} // ignore plus sign

                if (input_.eat('0')) { *p++ = '0'; } // put '0', leading zeros are not allowed in JSON.
                else if (is_digit(*input_))          // not zero
                {
                    while (is_digit(*input_))
                        if (p < integer_limit) *p++ = static_cast<char_type>(*input_++);  // put digit
                        else if (exp_offset < maximum_exp_offset) ++exp_offset, ++input_; // drop digit
                        else throw bad_format("invalid number format: too long integer sequence");
                }
                else throw bad_format("invalid number format: expected a digit", *input_);
            }

            if (input_.eat('.')) // accept fraction point part
            {
                assert(p < fraction_limit);
                *p++ = '.'; // put decimal point
                integer_type = false;

                if (is_digit(*input_))
                {
                    // if integer part is zero (parse '-0.0000...ddd')
                    if ((buffer[0] == '0') || (buffer[0] == '-' && buffer[1] == '0'))
                    {
                        while (*input_ == '0')
                            if (exp_offset > minimum_exp_offset) --exp_offset, ++input_; // drop '0'
                            else throw bad_format("invalid number format: too long integer sequence");
                    }

                    while (is_digit(*input_))
                    {
                        if (p < fraction_limit) *p++ = static_cast<char_type>(*input_++); // put digit
                        else ++input_;                                                    // drop digit
                    }
                }
                else throw bad_format("invalid number format: expected a digit", *input_);
            }

            if (*input_ == 'e' || *input_ == 'E') // accept exponent part
            {
                ++input_; // 'e'
                integer_type = false;

                char exp_part[32]{};
                char* exp = exp_part;
                char* const exp_limit = exp_part + std::size(exp_part);

                // read

                if (input_.eat('-')) { *exp++ = '-'; }
                else if (input_.eat('+')) {} // drop '+'

                if (is_digit(*input_))
                {
                    while (is_digit(*input_))
                    {
                        if (exp < exp_limit) *exp++ = static_cast<char_type>(*input_++); // put digit
                        else ++input_;                                                   // drop digit (it must be overflow, handle later)
                    }
                }
                else throw bad_format("invalid number format: expected a digit", *input_);

                // parse exponent
                int exp_value{};
                auto [ptr, ec] = std::from_chars(exp_part, exp, exp_value, 10);

                if (ec == std::errc{} && ptr == exp)
                {
                    exp_offset = exp_offset > 0 && exp_value > maximum_exp_offset - exp_offset ? maximum_exp_offset : exp_offset < 0 && exp_value < minimum_exp_offset - exp_offset ? minimum_exp_offset : exp_offset + exp_value;
                }
                else if (ec == std::errc::result_out_of_range && ptr == exp)
                {
                    exp_offset = exp_part[0] == '-' ? maximum_exp_offset : minimum_exp_offset;
                }
                else // other error (bug)
                {
                    assert(false);
                    throw bad_format("invalid number format: unexpected parse error "); // unexpected
                }
            }

            if (exp_offset != 0) // append parsed exponent part to buffer
            {
                integer_type = false;
                assert(p < decimal_limit);
                if (p < decimal_limit) *p++ = 'e';
                auto [ptr, ec] = std::to_chars(p, decimal_limit, exp_offset, 10);
                if (ec != std::errc{}) throw bad_format("invalid number format: unexpected error.");
                p = ptr;
            }

            // try to parse as integer type
            if (integer_type)
            {
                json::js_integer ret{};
                auto [ptr, ec] = std::from_chars(buffer, p, ret, 10);
                if (ec == std::errc{} && ptr == p) return json{in_place_index::integer, ret}; // integer OK
            }

            // try to parse as floating type (should succeed)
            {
                json::js_floating ret{};
#if (defined(__cpp_lib_to_chars) && __cpp_lib_to_chars >= 201611L) // compiler has floating-point from_chars
                auto [ptr, ec] = std::from_chars(buffer, p, ret);
#else // use fallback implementation
                std::istringstream tmp{std::string(buffer, p)};
                tmp.imbue(std::locale::classic());
                tmp >> ret;
                std::errc ec = !tmp ? std::errc::result_out_of_range : std::errc{}; // if fails, assume it must be out of range.
                const char* ptr = !tmp ? p : tmp.eof() ? p : buffer + tmp.tellg();
#endif

                assert(ec == std::errc{} || ec == std::errc::result_out_of_range);
                assert(ptr == p);

                if (ptr == p && ec == std::errc{}) return json{in_place_index::floating, ret}; // floating OK

                if (ec == std::errc::result_out_of_range) // overflow or underflow
                {
                    if (exp_offset >= 0) // overflow
                        return json{in_place_index::floating, buffer[0] != '-' ? +std::numeric_limits<json::js_floating>::infinity() : -std::numeric_limits<json::js_floating>::infinity()};
                    else // underflow
                        return json{in_place_index::floating, buffer[0] != '-' ? +static_cast<json::js_floating>(+0.0) : -static_cast<json::js_floating>(-0.0)};
                }
            }

            assert(false);
            throw bad_format("invalid number format: failed to parse");
        }